

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O2

bool hashSearch2<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *vals,string *hash_str,string *map_name,string *default_value,
               uint8_t expansion,uint8_t reduction,bool nonKeyLookups)

{
  pointer pbVar1;
  string map_name_00;
  pointer pBVar2;
  pointer pBVar3;
  Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar4;
  bool bVar5;
  ushort uVar6;
  uint32_t uVar7;
  size_t n1;
  size_t n2;
  undefined4 *puVar8;
  ulong uVar9;
  long lVar10;
  size_type sVar11;
  Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bin;
  ulong uVar12;
  __normal_iterator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __i;
  long lVar13;
  pointer pBVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pointer key_00;
  undefined8 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef6;
  vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  layer1;
  string local_b0 [32];
  string local_90 [32];
  vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  vector<bool,_std::allocator<bool>_> final_layer;
  
  if ((ulong)((long)(keys->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdc,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  bVar5 = hasDuplicates<std::__cxx11::string>(keys);
  if (bVar5) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdd,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  lVar10 = (long)(vals->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(vals->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (lVar10 != (long)(keys->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(keys->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xde,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  n1 = getModulusBitmask(((ulong)expansion * (lVar10 >> 5)) / (ulong)reduction);
  n2 = getModulusBitmask((long)(keys->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(keys->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5);
  uVar12 = 0;
  do {
    if (uVar12 == 0x20) {
LAB_001082eb:
      return uVar12 < 0x20;
    }
    uVar6 = (ushort)(byte)(&DAT_0010fa60)[uVar12];
    std::__cxx11::string::string(local_b0,(string *)map_name);
    std::
    vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&layer1,n1 + 1,(allocator_type *)&final_layer);
    puVar8 = (undefined4 *)
             CONCAT71(layer1.
                      super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      layer1.
                      super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    for (sVar11 = 0; n1 + 1 != sVar11; sVar11 = sVar11 + 1) {
      *puVar8 = (int)sVar11;
      puVar8 = puVar8 + 8;
    }
    pbVar1 = (keys->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (key_00 = (keys->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pBVar3 = layer1.
                 super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, key_00 != pbVar1; key_00 = key_00 + 1)
    {
      uVar7 = hash2(key_00,(SeedType *)&stack0xfffffffffffffef4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(CONCAT71(layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                      (ulong)(uVar7 & (uint)n1) * 0x20 + 8),key_00);
    }
    pBVar2 = (pointer)CONCAT71(layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pBVar2 != layer1.
                  super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      lVar13 = (long)layer1.
                     super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2;
      uVar9 = lVar13 >> 5;
      lVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                (pBVar2,layer1.
                        super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e)
      ;
      if (lVar13 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                  (pBVar2,pBVar3);
      }
      else {
        pBVar14 = pBVar2 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                  (pBVar2,pBVar14);
        for (; pBVar14 != pBVar3; pBVar14 = pBVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Val_comp_iter<testSeed<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                    (pBVar14);
        }
      }
    }
    uVar9 = *(long *)(CONCAT71(layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x10) -
            *(long *)(CONCAT71(layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8);
    if (uVar9 == 0x20) {
      std::
      vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&layer1);
      std::__cxx11::string::~string(local_b0);
      goto LAB_001082eb;
    }
    if (uVar9 < 0x121) {
      in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 & 0xffffff;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&final_layer,n2 + 1,(bool *)&stack0xfffffffffffffef3,
                 (allocator_type *)&stack0xfffffffffffffef7);
      pBVar3 = layer1.
               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar4 = (Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT71(layer1.
                           super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           layer1.
                           super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_1_);
      do {
        bin = pBVar4;
        if (bin == pBVar3) {
          std::
          vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector(&local_70,&layer1);
          std::__cxx11::string::string(local_90,local_b0);
          map_name_00._M_string_length = (size_type)default_value;
          map_name_00._M_dataplus._M_p = (pointer)local_90;
          map_name_00.field_2._M_local_buf[0] = nonKeyLookups;
          map_name_00.field_2._M_allocated_capacity._1_7_ = 0;
          map_name_00.field_2._8_8_ = in_stack_fffffffffffffee8;
          writeHash2<std::__cxx11::string>
                    (keys,(SeedType *)&stack0xfffffffffffffef4,n1,n2,vals,&local_70,hash_str,
                     map_name_00,
                     (string *)
                     CONCAT26(in_stack_fffffffffffffef6,CONCAT24(uVar6,in_stack_fffffffffffffef0)),
                     (bool)layer1.
                           super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_1_);
          std::__cxx11::string::~string(local_90);
          std::
          vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_70);
          break;
        }
        bVar5 = findSeed<std::__cxx11::string>(bin,n2,&final_layer);
        pBVar4 = bin + 1;
      } while (bVar5);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&final_layer.super__Bvector_base<std::allocator<bool>_>);
      std::
      vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&layer1);
      std::__cxx11::string::~string(local_b0);
      if (bin == pBVar3) goto LAB_001082eb;
    }
    else {
      std::
      vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&layer1);
      std::__cxx11::string::~string(local_b0);
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

bool hashSearch2(const std::vector<KeyType>& keys,
                 const std::vector<std::string>& vals,
                 std::string& hash_str,
                 std::string map_name = "PoifectMap",
                 std::string default_value = "",
                 uint8_t expansion = 1,
                 uint8_t reduction = 1,
                 bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    const size_t n1 = getModulusBitmask(keys.size()*expansion/reduction);
    const size_t n2 = getModulusBitmask(keys.size());

    const uint8_t primes[32] = {  0,   1,   2,   3,   5,
                                  7,  11,  13,  17,  19,
                                 23,  29,  31,  37,  41,
                                 43,  47,  53,  59,  61,
                                 67,  71,  73,  79,  83,
                                 89,  97, 101, 103, 107,
                                109, 113};

    for(SeedType seed = 0; seed < 32; seed++)
        if(testSeed<KeyType>(keys, primes[seed], n1, n2, vals, hash_str, map_name, default_value, nonKeyLookups))
            return true;

    return false;
}